

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_vfs_or_default_open_w
                    (ma_vfs *pVFS,wchar_t *pFilePath,ma_uint32 openMode,ma_vfs_file *pFile)

{
  ma_result mVar1;
  
  if (pVFS == (ma_vfs *)0x0) {
    mVar1 = ma_default_vfs_open_w((ma_vfs *)0x0,pFilePath,openMode,pFile);
    return mVar1;
  }
  mVar1 = MA_INVALID_ARGS;
  if (pFile != (ma_vfs_file *)0x0) {
    *pFile = (ma_vfs_file)0x0;
    if (openMode != 0 && pFilePath != (wchar_t *)0x0) {
      if (*(code **)((long)pVFS + 8) != (code *)0x0) {
        mVar1 = (**(code **)((long)pVFS + 8))();
        return mVar1;
      }
      mVar1 = MA_NOT_IMPLEMENTED;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_vfs_or_default_open_w(ma_vfs* pVFS, const wchar_t* pFilePath, ma_uint32 openMode, ma_vfs_file* pFile)
{
    if (pVFS != NULL) {
        return ma_vfs_open_w(pVFS, pFilePath, openMode, pFile);
    } else {
        return ma_default_vfs_open_w(pVFS, pFilePath, openMode, pFile);
    }
}